

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O0

bool __thiscall helics::CommsInterface::propertyLock(CommsInterface *this)

{
  bool bVar1;
  ConnectionStatus CVar2;
  bool exp;
  memory_order in_stack_00000028;
  bool in_stack_0000002f;
  bool *in_stack_00000030;
  atomic<bool> *in_stack_00000038;
  
  do {
    bVar1 = std::atomic<bool>::compare_exchange_weak
                      (in_stack_00000038,in_stack_00000030,in_stack_0000002f,in_stack_00000028);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return true;
    }
    CVar2 = std::atomic::operator_cast_to_ConnectionStatus
                      ((atomic<helics::CommsInterface::ConnectionStatus> *)0x461451);
  } while (CVar2 == STARTUP);
  return false;
}

Assistant:

bool CommsInterface::propertyLock()
{
    bool exp = false;
    while (!operating.compare_exchange_weak(exp, true)) {
        if (txStatus != ConnectionStatus::STARTUP) {
            return false;
        }
    }
    return true;
}